

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall xLearn::InmemReader::SetShuffle(InmemReader *this,bool shuffle)

{
  bool bVar1;
  byte in_SIL;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  unaff_retaddr;
  undefined7 in_stack_fffffffffffffff0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  
  *(byte *)((long)&in_RDI[6].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1) = in_SIL & 1;
  if (((ulong)in_RDI[6].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish & 0x100) != 0) {
    __last._M_current = (uint *)in_RDI;
    bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       (CONCAT17(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffffffffffff));
    if (!bVar1) {
      srand(*(uint *)&in_RDI[8].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_RDI);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_RDI);
      std::
      random_shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (unaff_retaddr,__last);
    }
  }
  return;
}

Assistant:

virtual inline void SetShuffle(bool shuffle) {
    this->shuffle_ = shuffle;
    if (shuffle_ && !order_.empty()) {
      srand(this->seed_);
      random_shuffle(order_.begin(), order_.end());
    }
  }